

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall tiger::trains::world::World::~World(World *this)

{
  pointer ppIVar1;
  pointer ppTVar2;
  pointer ppPVar3;
  Player *this_00;
  pointer ppPVar4;
  pointer ppLVar5;
  pointer pvVar6;
  pointer ppIVar7;
  pointer ppIVar8;
  pointer ppIVar9;
  pointer ppTVar10;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *eventList
  ;
  pointer ppPVar11;
  pointer ppPVar12;
  pointer ppLVar13;
  pointer pvVar14;
  
  this->_vptr_World = (_func_int **)&PTR__World_0019abd0;
  ppIVar1 = (this->postList).
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar9 = (this->postList).
                 super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar9 != ppIVar1;
      ppIVar9 = ppIVar9 + 1) {
    if (*ppIVar9 != (IPost *)0x0) {
      (*(*ppIVar9)->_vptr_IPost[1])();
    }
  }
  ppTVar2 = (this->trainList).
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar10 = (this->trainList).
                  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar2;
      ppTVar10 = ppTVar10 + 1) {
    if (*ppTVar10 != (Train *)0x0) {
      (*((*ppTVar10)->super_IUpgradeble)._vptr_IUpgradeble[1])();
    }
  }
  ppPVar3 = (this->playerList).
            super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar11 = (this->playerList).
                  super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppPVar11 != ppPVar3;
      ppPVar11 = ppPVar11 + 1) {
    this_00 = *ppPVar11;
    if (this_00 != (Player *)0x0) {
      Player::~Player(this_00);
    }
    operator_delete(this_00,0x48);
  }
  ppPVar4 = (this->pointList).
            super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar12 = (this->pointList).
                  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppPVar12 != ppPVar4;
      ppPVar12 = ppPVar12 + 1) {
    operator_delete(*ppPVar12,0x18);
  }
  ppLVar5 = (this->lineList).
            super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar13 = (this->lineList).
                  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppLVar13 != ppLVar5;
      ppLVar13 = ppLVar13 + 1) {
    operator_delete(*ppLVar13,0x20);
  }
  pvVar6 = (this->eventsHistory).
           super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar14 = (this->eventsHistory).
                 super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar6; pvVar14 = pvVar14 + 1
      ) {
    ppIVar7 = (pvVar14->
              super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar8 = (pvVar14->
                   super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar7;
        ppIVar8 = ppIVar8 + 1) {
      if (*ppIVar8 != (IEvent *)0x0) {
        (*(*ppIVar8)->_vptr_IEvent[1])();
      }
    }
  }
  std::
  vector<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ::~vector(&this->eventsHistory);
  std::
  _Rb_tree<const_tiger::trains::world::Player_*,_std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~_Rb_tree(&(this->trainsOfPlayer)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Line_*,_std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>,_std::less<const_tiger::trains::world::Line_*>,_std::allocator<std::pair<const_tiger::trains::world::Line_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::~_Rb_tree(&(this->trainsOfLine)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Point_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&(this->pointOfPost)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_int>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  ::~_Rb_tree(&(this->postOfPoint)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~_Rb_tree(&(this->playerOfName)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Player_*,_std::pair<const_tiger::trains::world::Player_*const,_int>,_std::_Select1st<std::pair<const_tiger::trains::world::Player_*const,_int>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_int>_>_>
  ::~_Rb_tree(&(this->homes)._M_t);
  std::
  _Rb_tree<const_tiger::trains::world::Point_*,_std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>,_std::_Select1st<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>_>_>
  ::~_Rb_tree(&(this->graph)._M_t);
  std::_Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>::
  ~_Vector_base(&(this->lineList).
                 super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
               );
  std::_Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
  ~_Vector_base(&(this->pointList).
                 super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
               );
  std::_Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>::
  ~_Vector_base(&(this->postList).
                 super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
               );
  std::_Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
  ~_Vector_base(&(this->trainList).
                 super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
               );
  std::_Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
  ::~_Vector_base(&(this->playerList).
                   super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                 );
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Train_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Train_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Train_*>_>_>
  ::~_Rb_tree(&(this->trainMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Line_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Line_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Line_*>_>_>
  ::~_Rb_tree(&(this->lineMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::Point_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::Point_*>_>_>
  ::~_Rb_tree(&(this->pointMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tiger::trains::world::Player_*>_>_>
  ::~_Rb_tree(&(this->playerMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_tiger::trains::world::IPost_*>,_std::_Select1st<std::pair<const_int,_tiger::trains::world::IPost_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tiger::trains::world::IPost_*>_>_>
  ::~_Rb_tree(&(this->postMap)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->nameScoreMap)._M_t);
  std::
  _Rb_tree<tiger::trains::world::Player_*,_std::pair<tiger::trains::world::Player_*const,_int>,_std::_Select1st<std::pair<tiger::trains::world::Player_*const,_int>_>,_std::less<tiger::trains::world::Player_*>,_std::allocator<std::pair<tiger::trains::world::Player_*const,_int>_>_>
  ::~_Rb_tree(&(this->scoreMap)._M_t);
  return;
}

Assistant:

World::~World()
{
    for (IPost *post : getPostList())
        delete post;

    for (Train *train : getTrainList())
        delete train;

    for (Player *player : getPlayerList())
        delete player;

    for (Point *point : getPointList())
        delete point;

    for (Line *line : getLineList())
        delete line;

    for (std::vector<IEvent *> &eventList : eventsHistory)
        for (IEvent *event : eventList)
            delete event;
}